

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O1

void __thiscall
net_uv::UVTimer::start
          (UVTimer *this,uv_loop_t *loop,uv_timer_cb cb,uint64_t timeout,uint64_t repeat,void *data)

{
  if (this->m_start == false) {
    uv_timer_init(loop,&this->m_timer);
    (this->m_timer).data = data;
    uv_timer_start(&this->m_timer,cb,timeout,repeat);
    this->m_start = true;
  }
  return;
}

Assistant:

void UVTimer::start(uv_loop_t* loop, uv_timer_cb cb, uint64_t timeout, uint64_t repeat, void* data)
{
	if (m_start)
		return;

	uv_timer_init(loop, &m_timer);
	m_timer.data = data;

	uv_timer_start(&m_timer, cb, timeout, repeat);
	m_start = true;
}